

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::AppendTransientSegment(ColumnData *this,SegmentLock *l,idx_t start_row)

{
  DatabaseInstance *db;
  idx_t iVar1;
  idx_t iVar2;
  unsigned_long uVar3;
  DBConfig *this_00;
  CompressionFunction *function_00;
  ulong segment_size;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> local_50;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> new_segment;
  optional_ptr<duckdb::CompressionFunction,_true> function;
  
  iVar1 = BlockManager::GetBlockSize(this->block_manager);
  iVar2 = GetTypeIdSize((this->type).physical_type_);
  uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
  segment_size = iVar2 << 0xb;
  if (uVar3 != start_row) {
    segment_size = iVar1;
  }
  if (iVar1 < segment_size) {
    segment_size = iVar1;
  }
  this->allocation_size = this->allocation_size + segment_size;
  db = this->info->db->db;
  this_00 = DBConfig::GetConfig(db);
  function = DBConfig::GetCompressionFunction
                       (this_00,COMPRESSION_UNCOMPRESSED,(this->type).physical_type_);
  function_00 = optional_ptr<duckdb::CompressionFunction,_true>::operator*(&function);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)&new_segment,db,function_00,&this->type,start_row,segment_size,
             this->block_manager);
  local_50._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
        )(__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
          )new_segment.
           super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
           .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  new_segment.super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)
       (__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
        )0x0;
  AppendSegment(this,l,(unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                        *)&local_50);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            (&local_50);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            (&new_segment.
              super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>);
  return;
}

Assistant:

void ColumnData::AppendTransientSegment(SegmentLock &l, idx_t start_row) {

	const auto block_size = block_manager.GetBlockSize();
	const auto type_size = GetTypeIdSize(type.InternalType());
	auto vector_segment_size = block_size;

	if (start_row == NumericCast<idx_t>(MAX_ROW_ID)) {
#if STANDARD_VECTOR_SIZE < 1024
		vector_segment_size = 1024 * type_size;
#else
		vector_segment_size = STANDARD_VECTOR_SIZE * type_size;
#endif
	}

	// The segment size is bound by the block size, but can be smaller.
	idx_t segment_size = block_size < vector_segment_size ? block_size : vector_segment_size;
	allocation_size += segment_size;

	auto &db = GetDatabase();
	auto &config = DBConfig::GetConfig(db);
	auto function = config.GetCompressionFunction(CompressionType::COMPRESSION_UNCOMPRESSED, type.InternalType());

	auto new_segment =
	    ColumnSegment::CreateTransientSegment(db, *function, type, start_row, segment_size, block_manager);
	AppendSegment(l, std::move(new_segment));
}